

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

bool __thiscall QFont::operator==(QFont *this,QFont *f)

{
  qreal *pqVar1;
  double dVar2;
  QFontPrivate *pQVar3;
  QFontPrivate *pQVar4;
  bool bVar5;
  
  pQVar3 = (this->d).d.ptr;
  pQVar4 = (f->d).d.ptr;
  if (pQVar4 == pQVar3) {
    bVar5 = true;
  }
  else {
    bVar5 = QFontDef::operator==(&pQVar4->request,&pQVar3->request);
    if (bVar5) {
      pQVar3 = (f->d).d.ptr;
      dVar2 = (pQVar3->request).pointSize;
      pQVar4 = (this->d).d.ptr;
      pqVar1 = &(pQVar4->request).pointSize;
      if ((((dVar2 == *pqVar1) && (!NAN(dVar2) && !NAN(*pqVar1))) &&
          (pQVar3->field_0x7c == pQVar4->field_0x7c)) &&
         (((pQVar3->letterSpacing).val == (pQVar4->letterSpacing).val &&
          ((pQVar3->wordSpacing).val == (pQVar4->wordSpacing).val)))) {
        bVar5 = comparesEqual<QFont::Tag,_unsigned_int,_true>(&pQVar3->features,&pQVar4->features);
        return bVar5;
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool QFont::operator==(const QFont &f) const
{
    return (f.d == d
            || (f.d->request   == d->request
                && f.d->request.pointSize == d->request.pointSize
                && f.d->underline == d->underline
                && f.d->overline  == d->overline
                && f.d->strikeOut == d->strikeOut
                && f.d->kerning == d->kerning
                && f.d->capital == d->capital
                && f.d->letterSpacingIsAbsolute == d->letterSpacingIsAbsolute
                && f.d->letterSpacing == d->letterSpacing
                && f.d->wordSpacing == d->wordSpacing
                && f.d->features == d->features
            ));
}